

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall
QString::repeated(QString *__return_storage_ptr__,QString *this,qsizetype times)

{
  Data *pDVar1;
  char16_t *__old_val;
  long lVar2;
  qsizetype alloc;
  longlong __old_val_1;
  long lVar3;
  size_t sVar4;
  char16_t *pcVar5;
  size_t __n;
  long in_FS_OFFSET;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->d).size;
  if (lVar3 == 0) {
LAB_00335a8f:
    pDVar1 = (this->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (this->d).ptr;
    (__return_storage_ptr__->d).size = lVar3;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    if (times < 2) {
      if (times != 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
          (__return_storage_ptr__->d).size = 0;
          return __return_storage_ptr__;
        }
        goto LAB_00335c47;
      }
      goto LAB_00335a8f;
    }
    lVar3 = lVar3 * times;
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
    alloc = 0;
    if (0 < lVar3) {
      alloc = lVar3;
    }
    reallocData(&local_58,alloc,KeepSize);
    if (&(local_58.d.d)->super_QArrayData == (QArrayData *)0x0) {
LAB_00335af5:
      lVar2 = 0;
    }
    else {
      if (*(qsizetype *)((long)local_58.d.d + 8) != 0) {
        *(byte *)&(((ArrayOptions *)((long)local_58.d.d + 4))->
                  super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(((ArrayOptions *)((long)local_58.d.d + 4))->
                   super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
      if (&(local_58.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_00335af5;
      lVar2 = *(qsizetype *)((long)local_58.d.d + 8);
    }
    if (lVar2 == lVar3) {
      memcpy(local_58.d.ptr,(this->d).ptr,(this->d).size * 2);
      __n = (this->d).size;
      pcVar5 = local_58.d.ptr + __n;
      lVar2 = lVar3 >> 1;
      sVar4 = __n;
      if ((long)__n <= lVar2) {
        do {
          __n = sVar4 * 2;
          memcpy(pcVar5,local_58.d.ptr,__n);
          pcVar5 = pcVar5 + sVar4;
          sVar4 = __n;
        } while (__n - lVar2 == 0 || (long)__n < lVar2);
      }
      memcpy(pcVar5,local_58.d.ptr,(lVar3 - __n) * 2);
      pcVar5 = local_58.d.ptr;
      pDVar1 = local_58.d.d;
      local_58.d.ptr[lVar3] = L'\0';
      local_58.d.d = (Data *)0x0;
      (__return_storage_ptr__->d).d = pDVar1;
      local_58.d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).ptr = pcVar5;
      local_58.d.size = 0;
      (__return_storage_ptr__->d).size = lVar3;
    }
    else {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00335c47:
  __stack_chk_fail();
}

Assistant:

QString QString::repeated(qsizetype times) const
{
    if (d.size == 0)
        return *this;

    if (times <= 1) {
        if (times == 1)
            return *this;
        return QString();
    }

    const qsizetype resultSize = times * d.size;

    QString result;
    result.reserve(resultSize);
    if (result.capacity() != resultSize)
        return QString(); // not enough memory

    memcpy(result.d.data(), d.data(), d.size * sizeof(QChar));

    qsizetype sizeSoFar = d.size;
    char16_t *end = result.d.data() + sizeSoFar;

    const qsizetype halfResultSize = resultSize >> 1;
    while (sizeSoFar <= halfResultSize) {
        memcpy(end, result.d.data(), sizeSoFar * sizeof(QChar));
        end += sizeSoFar;
        sizeSoFar <<= 1;
    }
    memcpy(end, result.d.data(), (resultSize - sizeSoFar) * sizeof(QChar));
    result.d.data()[resultSize] = '\0';
    result.d.size = resultSize;
    return result;
}